

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_atomics_isLockFree(JSContext *ctx,JSValue this_obj,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSValue JVar4;
  int v;
  int local_c;
  int *local_8;
  
  local_8 = (int *)(argv->u).ptr;
  JVar4 = *argv;
  if (0xfffffff4 < (uint)argv->tag) {
    *local_8 = *local_8 + 1;
  }
  iVar1 = JS_ToInt32SatFree(ctx,&local_c,JVar4);
  if (iVar1 == 0) {
    JVar2._0_1_ = local_c == 4 || local_c - 1U < 2;
    JVar2._1_7_ = 0;
    iVar3 = 1;
  }
  else {
    iVar3 = 6;
    JVar2.float64 = 0.0;
  }
  JVar4.tag = iVar3;
  JVar4.u.float64 = JVar2.float64;
  return JVar4;
}

Assistant:

static JSValue js_atomics_isLockFree(JSContext *ctx,
                                     JSValueConst this_obj,
                                     int argc, JSValueConst *argv)
{
    int v, ret;
    if (JS_ToInt32Sat(ctx, &v, argv[0]))
        return JS_EXCEPTION;
    ret = (v == 1 || v == 2 || v == 4
#ifdef CONFIG_BIGNUM
           || v == 8
#endif
           );
    return JS_NewBool(ctx, ret);
}